

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_nil_us
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write)

{
  ushort uVar1;
  ImageObject *pIVar2;
  bool bVar3;
  element_type *peVar4;
  Atom *pAVar5;
  Atom local_50 [4];
  Atom local_4c [4];
  Atom local_48 [16];
  Atom local_38 [7];
  byte local_31;
  uint16_t *puStack_30;
  bool write_local;
  uint16_t *extent_index_local;
  Ptr *pPStack_20;
  uint16_t write_index_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_31 = write;
  puStack_30 = extent_index;
  extent_index_local._6_2_ = write_index;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  peVar4 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  bVar3 = std::operator==(&peVar4->cmd,"|ms");
  if (bVar3) {
    if ((local_31 & 1) != 0) {
      r_code::Atom::IPointer((ushort)local_38);
      pAVar5 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(this->current_object + 8),
                          (ulong)extent_index_local._6_2_);
      r_code::Atom::operator=(pAVar5,local_38);
      r_code::Atom::~Atom(local_38);
      r_code::Atom::UndefinedTimestamp();
      pIVar2 = this->current_object;
      uVar1 = *puStack_30;
      *puStack_30 = uVar1 + 1;
      pAVar5 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
      r_code::Atom::operator=(pAVar5,local_48);
      r_code::Atom::~Atom(local_48);
      r_code::Atom::Atom(local_4c,0xffffffff);
      pIVar2 = this->current_object;
      uVar1 = *puStack_30;
      *puStack_30 = uVar1 + 1;
      pAVar5 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
      r_code::Atom::operator=(pAVar5,local_4c);
      r_code::Atom::~Atom(local_4c);
      r_code::Atom::Atom(local_50,0xffffffff);
      pIVar2 = this->current_object;
      uVar1 = *puStack_30;
      *puStack_30 = uVar1 + 1;
      pAVar5 = r_code::vector<r_code::Atom>::operator[]
                         ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
      r_code::Atom::operator=(pAVar5,local_50);
      r_code::Atom::~Atom(local_50);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::read_nil_us(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (node->cmd == "|ms") {
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::UndefinedTimestamp();
            current_object->code[extent_index++] = UINT32_MAX;
            current_object->code[extent_index++] = UINT32_MAX;
        }

        return true;
    }

    return false;
}